

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unique_ptr_test.cpp
# Opt level: O2

void __thiscall unique_ptr_swap_ptr_Test::~unique_ptr_swap_ptr_Test(unique_ptr_swap_ptr_Test *this)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  testing::Test::~Test(&this->super_Test);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    operator_delete(this,0x10);
    return;
  }
  __stack_chk_fail();
}

Assistant:

TEST(unique_ptr, swap_ptr)
{
    // Create a unique_ptr
    unique_ptr<Struct2> xPtr(new Struct2(123));

    EXPECT_EQ(true, xPtr);
    EXPECT_NE((void*)NULL, xPtr.get());
    EXPECT_EQ(123,xPtr->mVal);
    EXPECT_EQ(1, Struct2::_mNbInstances);
    Struct2* pX = xPtr.get();

    // Create another unique_ptr
    unique_ptr<Struct2> yPtr(new Struct2(234));

    EXPECT_EQ(true, yPtr);
    EXPECT_NE((void*)NULL, yPtr.get());
    EXPECT_EQ(234, yPtr->mVal);
    EXPECT_EQ(2, Struct2::_mNbInstances);
    Struct2* pY = yPtr.get();

    if (pX < pY)
    {
        EXPECT_LT(xPtr, yPtr);
        xPtr.swap(yPtr);
        EXPECT_GT(xPtr, yPtr);
        EXPECT_EQ(true, xPtr);
        EXPECT_EQ(true, yPtr);
    }
    else // (pX > pY)
    {
        EXPECT_GT(xPtr, yPtr);
        xPtr.swap(yPtr);
        EXPECT_LT(xPtr, yPtr);
        EXPECT_EQ(true, xPtr);
        EXPECT_EQ(true, yPtr);
    }
}